

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntMap.h
# Opt level: O3

void __thiscall
Minisat::IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>::insert
          (IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_> *this,int key,
          VarData val)

{
  vec<Minisat::Solver::VarData,_int>::growTo(&this->map,key + 1);
  if (key < (this->map).sz) {
    (this->map).data[key] = val;
    return;
  }
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, Minisat::Solver::VarData>::operator[](K) [K = int, V = Minisat::Solver::VarData, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void     insert (K key, V val)       { reserve(key); operator[](key) = val; }